

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::serialize_application_info
          (Impl *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *blob)

{
  pointer __dest;
  bool bVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc;
  Ch *__src;
  Value pdf_info;
  Value app_info;
  Data local_128;
  Data local_118;
  Data local_108;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_f8;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMStack_f0;
  Stack<rapidjson::CrtAllocator> local_e8;
  undefined4 local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  CrtAllocator *pCStack_98;
  char *local_90;
  char *pcStack_88;
  char *local_80;
  size_t local_78;
  int local_70;
  bool local_6c;
  CrtAllocator *local_68;
  CrtAllocator *pCStack_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  size_t local_40;
  
  local_e8.stack_ = (char *)0x0;
  local_e8.stackTop_ = (char *)0x0;
  local_e8.allocator_ = (CrtAllocator *)0x0;
  local_e8.ownAllocator_ = (CrtAllocator *)0x0;
  local_f8 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  pMStack_f0 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  local_108.n = (Number)0x0;
  local_108.s.str = (Ch *)0x0;
  local_e8.stackEnd_ = (char *)0x0;
  local_e8.initialCapacity_ = 0x400;
  local_b8 = 0;
  local_b0 = 0;
  alloc = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
  alloc->chunkHead_ = (ChunkHeader *)0x0;
  alloc->chunk_capacity_ = 0x10000;
  alloc->userBuffer_ = (void *)0x0;
  alloc->baseAllocator_ = (CrtAllocator *)0x0;
  alloc->ownBaseAllocator_ = (CrtAllocator *)0x0;
  local_108.n = (Number)0x0;
  local_108.s.str = (Ch *)0x3000000000000;
  local_118.n = (Number)0x0;
  local_118.s.str = (Ch *)0x3000000000000;
  local_128.n = (Number)0x0;
  local_128.s.str = (Ch *)0x3000000000000;
  local_f8 = alloc;
  pMStack_f0 = alloc;
  if (this->application_info != (VkApplicationInfo *)0x0) {
    serialize_application_info_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((Value *)&local_118.s,this->application_info,alloc);
  }
  if (this->physical_device_features != (VkPhysicalDeviceFeatures2 *)0x0) {
    bVar1 = serialize_physical_device_features_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)&local_128.s,this->physical_device_features,alloc);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0012eb26;
    }
  }
  pCStack_60 = (CrtAllocator *)0x405000000152df9;
  local_68 = (CrtAllocator *)0x7;
  local_a8._0_8_ = (Number)0x6;
  local_a8._8_8_ = (Ch *)0x1f6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_108.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_a8,alloc);
  local_a8._8_8_ = (Ch *)0x405000000152e2b;
  local_a8._0_8_ = (Number)0xf;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_108.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_a8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_118.s,alloc);
  local_a8._8_8_ = (Ch *)0x405000000152e3b;
  local_a8._0_8_ = (Number)0x16;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_108.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_a8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_128.s,alloc);
  local_48 = (char *)0x0;
  local_58 = (char *)0x0;
  pcStack_50 = (char *)0x0;
  local_68 = (CrtAllocator *)0x0;
  pCStack_60 = (CrtAllocator *)0x0;
  local_40 = 0x100;
  local_a8._8_8_ = (Ch *)0x0;
  pCStack_98 = (CrtAllocator *)0x0;
  local_90 = (char *)0x0;
  pcStack_88 = (char *)0x0;
  local_80 = (char *)0x0;
  local_78 = 0x200;
  local_70 = 0x144;
  local_6c = false;
  local_a8._0_8_ = &local_68;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_108.s,
             (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_a8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (blob,(long)pcStack_50 - (long)local_58);
  __dest = (blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &local_68);
  memcpy(__dest,__src,(long)pcStack_50 - (long)local_58);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
            ((Stack<rapidjson::CrtAllocator> *)(local_a8 + 8));
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
            ((Stack<rapidjson::CrtAllocator> *)&local_68);
  bVar1 = true;
LAB_0012eb26:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Destroy((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *)&local_108.s);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_e8);
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::serialize_application_info(vector<uint8_t> &blob) const
{
	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	Value app_info(kObjectType);
	Value pdf_info(kObjectType);
	if (application_info)
		serialize_application_info_inline(app_info, *application_info, alloc);
	if (physical_device_features)
		if (!serialize_physical_device_features_inline(pdf_info, *physical_device_features, alloc))
			return false;

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);
	doc.AddMember("applicationInfo", app_info, alloc);
	doc.AddMember("physicalDeviceFeatures", pdf_info, alloc);

	StringBuffer buffer;
	CustomWriter writer(buffer);
	doc.Accept(writer);

	blob.resize(buffer.GetSize());
	memcpy(blob.data(), buffer.GetString(), buffer.GetSize());
	return true;
}